

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImRect ImGui::GetPopupAllowedExtentRect(ImGuiWindow_conflict *window)

{
  ImGuiPlatformMonitor *pIVar1;
  ImGuiViewportP_conflict1 *pIVar2;
  long lVar3;
  ImVec2 IVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImRect IVar9;
  
  lVar3 = (long)window->ViewportAllowPlatformMonitorExtend;
  if (lVar3 < 0) {
    pIVar2 = window->Viewport;
    fVar6 = (pIVar2->super_ImGuiViewport).Pos.x + (pIVar2->super_ImGuiViewport).Size.x;
    fVar7 = (pIVar2->super_ImGuiViewport).Pos.y + (pIVar2->super_ImGuiViewport).Size.y;
    IVar4 = (pIVar2->super_ImGuiViewport).Pos;
  }
  else {
    if ((GImGui->PlatformIO).Monitors.Size <= window->ViewportAllowPlatformMonitorExtend) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                    ,0x706,
                    "T &ImVector<ImGuiPlatformMonitor>::operator[](int) [T = ImGuiPlatformMonitor]")
      ;
    }
    pIVar1 = (GImGui->PlatformIO).Monitors.Data;
    IVar4 = pIVar1[lVar3].WorkPos;
    fVar6 = pIVar1[lVar3].WorkPos.x + pIVar1[lVar3].WorkSize.x;
    fVar7 = pIVar1[lVar3].WorkPos.y + pIVar1[lVar3].WorkSize.y;
  }
  fVar5 = (GImGui->Style).DisplaySafeAreaPadding.x;
  fVar8 = (GImGui->Style).DisplaySafeAreaPadding.y;
  fVar5 = (float)(-(uint)(fVar5 + fVar5 < fVar6 - IVar4.x) & (uint)-fVar5);
  fVar8 = (float)(-(uint)(fVar8 + fVar8 < fVar7 - IVar4.y) & (uint)-fVar8);
  IVar9.Min.x = IVar4.x - fVar5;
  IVar9.Min.y = IVar4.y - fVar8;
  IVar9.Max.x = fVar5 + fVar6;
  IVar9.Max.y = fVar8 + fVar7;
  return IVar9;
}

Assistant:

ImRect ImGui::GetPopupAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImRect r_screen;
    if (window->ViewportAllowPlatformMonitorExtend >= 0)
    {
        // Extent with be in the frame of reference of the given viewport (so Min is likely to be negative here)
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[window->ViewportAllowPlatformMonitorExtend];
        r_screen.Min = monitor.WorkPos;
        r_screen.Max = monitor.WorkPos + monitor.WorkSize;
    }
    else
    {
        // Use the full viewport area (not work area) for popups
        r_screen = window->Viewport->GetMainRect();
    }
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}